

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_node.cpp
# Opt level: O3

string * __thiscall
duckdb::SelectNode::ToString_abi_cxx11_(string *__return_storage_ptr__,SelectNode *this)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  GroupByNode *this_01;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *this_02;
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  char cVar4;
  bool bVar5;
  pointer pTVar6;
  const_reference pvVar7;
  pointer pRVar8;
  DistinctModifier *pDVar9;
  reference this_03;
  pointer pPVar10;
  const_reference pvVar11;
  long *plVar12;
  undefined8 *puVar13;
  pointer psVar14;
  const_reference pvVar15;
  _Base_ptr p_Var16;
  pointer pSVar17;
  char *pcVar18;
  idx_t __val;
  size_type *psVar19;
  pointer psVar20;
  idx_t iVar21;
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
  *this_04;
  char cVar22;
  size_type sVar23;
  size_type __n;
  SelectNode *this_05;
  _Rb_tree_header *p_Var24;
  size_type __n_00;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *puVar25;
  string result;
  string __str;
  string local_f8;
  SelectNode *local_d8;
  allocator local_c9;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  char *local_a8;
  uint local_a0;
  char local_98 [16];
  string *local_88;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *local_80;
  vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
  *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar25 = &this->from_table;
  local_88 = __return_storage_ptr__;
  if (((this->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
       ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl == (TableRef *)0x0) ||
     (pTVar6 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                         (puVar25), pTVar6->type != SHOW_REF)) {
    local_c8 = local_b8;
    local_c0 = 0;
    local_b8[0] = 0;
    local_80 = puVar25;
    CommonTableExpressionMap::ToString_abi_cxx11_(&local_f8,&(this->super_QueryNode).cte_map);
    ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&local_c8);
    local_d8 = this;
    if ((this->super_QueryNode).modifiers.
        super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->super_QueryNode).modifiers.
        super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_04 = &(this->super_QueryNode).modifiers;
      __n_00 = 0;
      local_78 = this_04;
      do {
        pvVar7 = vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
                 ::operator[](this_04,__n_00);
        pRVar8 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->(pvVar7);
        if (pRVar8->type == DISTINCT_MODIFIER) {
          pvVar7 = vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
                   ::operator[](this_04,__n_00);
          pRVar8 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                   ::operator->(pvVar7);
          pDVar9 = ResultModifier::Cast<duckdb::DistinctModifier>(pRVar8);
          ::std::__cxx11::string::append((char *)&local_c8);
          if ((pDVar9->distinct_on_targets).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pDVar9->distinct_on_targets).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ::std::__cxx11::string::append((char *)&local_c8);
            if ((pDVar9->distinct_on_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (pDVar9->distinct_on_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              sVar23 = 0;
              do {
                if (sVar23 != 0) {
                  ::std::__cxx11::string::append((char *)&local_c8);
                }
                this_03 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          ::operator[](&pDVar9->distinct_on_targets,sVar23);
                pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          ::operator->(this_03);
                (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_f8,pPVar10);
                ::std::__cxx11::string::_M_append
                          ((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p);
                }
                sVar23 = sVar23 + 1;
              } while (sVar23 < (ulong)((long)(pDVar9->distinct_on_targets).
                                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pDVar9->distinct_on_targets).
                                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
            ::std::__cxx11::string::append((char *)&local_c8);
            this_04 = local_78;
            this = local_d8;
          }
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)(this->super_QueryNode).modifiers.
                                      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->super_QueryNode).modifiers.
                                      super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((this->select_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->select_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = &local_d8->select_list;
      sVar23 = 0;
      do {
        if (sVar23 != 0) {
          ::std::__cxx11::string::append((char *)&local_c8);
        }
        pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[](this_00,sVar23);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar11);
        (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_f8,pPVar10);
        ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[](this_00,sVar23);
        pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar11);
        if ((pPVar10->super_BaseExpression).alias._M_string_length != 0) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," AS %s","");
          pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this_00,sVar23);
          pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar11);
          pcVar1 = (pPVar10->super_BaseExpression).alias._M_dataplus._M_p;
          local_50[0] = local_40;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,pcVar1,
                     pcVar1 + (pPVar10->super_BaseExpression).alias._M_string_length);
          StringUtil::Format<duckdb::SQLIdentifier>(&local_f8,&local_70,(SQLIdentifier *)local_50);
          ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        sVar23 = sVar23 + 1;
      } while (sVar23 < (ulong)((long)(local_d8->select_list).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_d8->select_list).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    puVar25 = local_80;
    this_05 = local_d8;
    if (((local_80->super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t
         .super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl != (TableRef *)0x0) &&
       (pTVar6 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                 operator->(local_80), pTVar6->type != EMPTY_FROM)) {
      pTVar6 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                         (puVar25);
      (*pTVar6->_vptr_TableRef[2])(&local_a8);
      plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dec8e8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8.field_2._8_8_ = plVar12[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_f8._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
    }
    if ((this_05->where_clause).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&this_05->where_clause);
      (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_a8);
      puVar13 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dec4ac);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar19 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_f8._M_string_length = puVar13[1];
      *puVar13 = psVar19;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
    }
    if ((this_05->groups).grouping_sets.
        super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        .
        super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_05->groups).grouping_sets.
        super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        .
        super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (this_05->aggregate_handling == FORCE_AGGREGATES) {
        ::std::__cxx11::string::append((char *)&local_c8);
      }
    }
    else {
      ::std::__cxx11::string::append((char *)&local_c8);
      psVar14 = (this_05->groups).grouping_sets.
                super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                .
                super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar20 = (this_05->groups).grouping_sets.
                super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                .
                super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar25 = (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                (((long)psVar20 - (long)psVar14 >> 4) * -0x5555555555555555);
      if (&DAT_00000001 < puVar25) {
        ::std::__cxx11::string::append((char *)&local_c8);
        psVar14 = (this_05->groups).grouping_sets.
                  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  .
                  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar20 = (this_05->groups).grouping_sets.
                  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  .
                  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (psVar20 != psVar14) {
        this_01 = &local_d8->groups;
        local_78 = (vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
                    *)&(local_d8->groups).grouping_sets;
        __n = 0;
        local_80 = puVar25;
        do {
          pvVar15 = vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
                    ::operator[]((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
                                  *)local_78,__n);
          if (__n != 0) {
            ::std::__cxx11::string::append((char *)&local_c8);
          }
          if ((pvVar15->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
            ::std::__cxx11::string::append((char *)&local_c8);
          }
          else {
            if (&DAT_00000001 < puVar25) {
              ::std::__cxx11::string::append((char *)&local_c8);
            }
            p_Var16 = (pvVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var24 = &(pvVar15->_M_t)._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)p_Var16 != p_Var24) {
              bVar5 = true;
              do {
                if (!bVar5) {
                  ::std::__cxx11::string::append((char *)&local_c8);
                }
                pvVar11 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          ::operator[](&this_01->group_expressions,*(size_type *)(p_Var16 + 1));
                pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          ::operator->(pvVar11);
                (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_f8,pPVar10);
                ::std::__cxx11::string::_M_append
                          ((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p);
                }
                p_Var16 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var16);
                bVar5 = false;
              } while ((_Rb_tree_header *)p_Var16 != p_Var24);
            }
            puVar25 = local_80;
            if (&DAT_00000001 < local_80) {
              ::std::__cxx11::string::append((char *)&local_c8);
            }
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)(local_d8->groups).grouping_sets.
                                      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      .
                                      super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_d8->groups).grouping_sets.
                                      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      .
                                      super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x5555555555555555));
      }
      this_05 = local_d8;
      if (&DAT_00000001 < puVar25) {
        ::std::__cxx11::string::append((char *)&local_c8);
      }
    }
    if ((this_05->having).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&this_05->having);
      (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_a8);
      puVar13 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dec4cf);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar19 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_f8._M_string_length = puVar13[1];
      *puVar13 = psVar19;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
    }
    if ((this_05->qualify).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&this_05->qualify);
      (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[8])(&local_a8);
      puVar13 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dec4d8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar19 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_f8._M_string_length = puVar13[1];
      *puVar13 = psVar19;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
    }
    if ((this_05->sample).
        super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
        super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
        .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0)
    {
      ::std::__cxx11::string::append((char *)&local_c8);
      this_02 = &this_05->sample;
      pSVar17 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                ::operator->(this_02);
      Value::ToString_abi_cxx11_(&local_f8,&pSVar17->sample_size);
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      pSVar17 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                ::operator->(this_02);
      if (pSVar17->is_percentage == true) {
        ::std::__cxx11::string::append((char *)&local_c8);
      }
      pSVar17 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                ::operator->(this_02);
      pcVar18 = EnumUtil::ToChars<duckdb::SampleMethod>(pSVar17->method);
      ::std::__cxx11::string::string((string *)&local_a8,pcVar18,&local_c9);
      puVar13 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1e0f04b);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar19 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar19;
        local_f8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_f8._M_string_length = puVar13[1];
      *puVar13 = psVar19;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      pSVar17 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                ::operator->(this_02);
      if ((pSVar17->seed).index != 0xffffffffffffffff) {
        pSVar17 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                  ::operator->(this_02);
        __val = optional_idx::GetIndex(&pSVar17->seed);
        cVar22 = '\x01';
        if (9 < __val) {
          iVar21 = __val;
          cVar4 = '\x04';
          do {
            cVar22 = cVar4;
            if (iVar21 < 100) {
              cVar22 = cVar22 + -2;
              goto LAB_0125079e;
            }
            if (iVar21 < 1000) {
              cVar22 = cVar22 + -1;
              goto LAB_0125079e;
            }
            if (iVar21 < 10000) goto LAB_0125079e;
            bVar5 = 99999 < iVar21;
            iVar21 = iVar21 / 10000;
            cVar4 = cVar22 + '\x04';
          } while (bVar5);
          cVar22 = cVar22 + '\x01';
        }
LAB_0125079e:
        local_a8 = local_98;
        ::std::__cxx11::string::_M_construct((ulong)&local_a8,cVar22);
        ::std::__detail::__to_chars_10_impl<unsigned_long>(local_a8,local_a0,__val);
        puVar13 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dcf0ae);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar19 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_f8.field_2._M_allocated_capacity = *psVar19;
          local_f8.field_2._8_8_ = puVar13[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar19;
          local_f8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_f8._M_string_length = puVar13[1];
        *puVar13 = psVar19;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
      }
      ::std::__cxx11::string::append((char *)&local_c8);
    }
    QueryNode::ResultModifiersToString_abi_cxx11_(&local_f8,&this_05->super_QueryNode);
    plVar12 = (long *)::std::__cxx11::string::replace
                                ((ulong)&local_f8,0,(char *)0x0,(ulong)local_c8);
    (local_88->_M_dataplus)._M_p = (pointer)&local_88->field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar19) {
      lVar2 = plVar12[3];
      (local_88->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&local_88->field_2 + 8) = lVar2;
    }
    else {
      (local_88->_M_dataplus)._M_p = (pointer)*plVar12;
      (local_88->field_2)._M_allocated_capacity = *psVar19;
    }
    local_88->_M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
  }
  else {
    pTVar6 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       (puVar25);
    psVar3 = local_88;
    (*pTVar6->_vptr_TableRef[2])(local_88,pTVar6);
    local_88 = psVar3;
  }
  return local_88;
}

Assistant:

string SelectNode::ToString() const {
	if (from_table && from_table->type == TableReferenceType::SHOW_REF) {
		D_ASSERT(select_list.size() == 1);
		return from_table->ToString();
	}
	string result;
	result = cte_map.ToString();
	result += "SELECT ";

	// search for a distinct modifier
	for (idx_t modifier_idx = 0; modifier_idx < modifiers.size(); modifier_idx++) {
		if (modifiers[modifier_idx]->type == ResultModifierType::DISTINCT_MODIFIER) {
			auto &distinct_modifier = modifiers[modifier_idx]->Cast<DistinctModifier>();
			result += "DISTINCT ";
			if (!distinct_modifier.distinct_on_targets.empty()) {
				result += "ON (";
				for (idx_t k = 0; k < distinct_modifier.distinct_on_targets.size(); k++) {
					if (k > 0) {
						result += ", ";
					}
					result += distinct_modifier.distinct_on_targets[k]->ToString();
				}
				result += ") ";
			}
		}
	}
	for (idx_t i = 0; i < select_list.size(); i++) {
		if (i > 0) {
			result += ", ";
		}
		result += select_list[i]->ToString();
		if (!select_list[i]->GetAlias().empty()) {
			result += StringUtil::Format(" AS %s", SQLIdentifier(select_list[i]->GetAlias()));
		}
	}
	if (from_table && from_table->type != TableReferenceType::EMPTY_FROM) {
		result += " FROM " + from_table->ToString();
	}
	if (where_clause) {
		result += " WHERE " + where_clause->ToString();
	}
	if (!groups.grouping_sets.empty()) {
		result += " GROUP BY ";
		// if we are dealing with multiple grouping sets, we have to add a few additional brackets
		bool grouping_sets = groups.grouping_sets.size() > 1;
		if (grouping_sets) {
			result += "GROUPING SETS (";
		}
		for (idx_t i = 0; i < groups.grouping_sets.size(); i++) {
			auto &grouping_set = groups.grouping_sets[i];
			if (i > 0) {
				result += ",";
			}
			if (grouping_set.empty()) {
				result += "()";
				continue;
			}
			if (grouping_sets) {
				result += "(";
			}
			bool first = true;
			for (auto &grp : grouping_set) {
				if (!first) {
					result += ", ";
				}
				result += groups.group_expressions[grp]->ToString();
				first = false;
			}
			if (grouping_sets) {
				result += ")";
			}
		}
		if (grouping_sets) {
			result += ")";
		}
	} else if (aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
		result += " GROUP BY ALL";
	}
	if (having) {
		result += " HAVING " + having->ToString();
	}
	if (qualify) {
		result += " QUALIFY " + qualify->ToString();
	}
	if (sample) {
		result += " USING SAMPLE ";
		result += sample->sample_size.ToString();
		if (sample->is_percentage) {
			result += "%";
		}
		result += " (" + EnumUtil::ToString(sample->method);
		if (sample->seed.IsValid()) {
			result += ", " + std::to_string(sample->seed.GetIndex());
		}
		result += ")";
	}
	return result + ResultModifiersToString();
}